

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O0

ValueType * __thiscall
llbuild::buildsystem::BuildValue::toData(ValueType *__return_storage_ptr__,BuildValue *this)

{
  bool bVar1;
  FileInfo *value;
  size_t in_RCX;
  void *__buf;
  uint local_12c;
  undefined1 local_128 [4];
  uint32_t i;
  BinaryEncoder coder;
  BuildValue *this_local;
  
  coder.encdata.super_SmallVectorStorage<unsigned_char,_256U>.InlineElts._248_8_ = this;
  basic::BinaryEncoder::BinaryEncoder((BinaryEncoder *)local_128);
  basic::BinaryEncoder::write<llbuild::buildsystem::BuildValue::Kind>
            ((BinaryEncoder *)local_128,&this->kind);
  bVar1 = kindHasSignature(this);
  if (bVar1) {
    basic::BinaryEncoder::write<llbuild::basic::CommandSignature>
              ((BinaryEncoder *)local_128,&this->signature);
  }
  bVar1 = kindHasOutputInfo(this);
  if (bVar1) {
    basic::BinaryEncoder::write((BinaryEncoder *)local_128,this->numOutputInfos,__buf,in_RCX);
    for (local_12c = 0; local_12c != this->numOutputInfos; local_12c = local_12c + 1) {
      value = getNthOutputInfo(this,local_12c);
      basic::BinaryEncoder::write<llbuild::basic::FileInfo>((BinaryEncoder *)local_128,value);
    }
  }
  bVar1 = kindHasStringList(this);
  if (bVar1) {
    basic::StringList::encode(&this->stringValues,(BinaryEncoder *)local_128);
  }
  basic::BinaryEncoder::contents(__return_storage_ptr__,(BinaryEncoder *)local_128);
  basic::BinaryEncoder::~BinaryEncoder((BinaryEncoder *)local_128);
  return __return_storage_ptr__;
}

Assistant:

inline core::ValueType buildsystem::BuildValue::toData() const {
  basic::BinaryEncoder coder;
  coder.write(kind);
  if (kindHasSignature())
    coder.write(signature);
  if (kindHasOutputInfo()) {
    coder.write(numOutputInfos);
    for (uint32_t i = 0; i != numOutputInfos; ++i) {
      coder.write(getNthOutputInfo(i));
    }
  }
  if (kindHasStringList()) {
    stringValues.encode(coder);
  }
  return coder.contents();
}